

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkDepends.cxx
# Opt level: O0

void __thiscall
cmComputeLinkDepends::AddVarLinkEntries(cmComputeLinkDepends *this,int depender_index,char *value)

{
  bool bVar1;
  pointer __s;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  char *__s1;
  undefined1 local_148 [8];
  cmLinkItem item;
  char *val;
  string var;
  string *d;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  undefined1 local_88 [3];
  bool haveLLT;
  cmTargetLinkLibraryType llt;
  vector<cmLinkItem,_std::allocator<cmLinkItem>_> actual_libs;
  allocator<char> local_59;
  string local_58;
  undefined1 local_38 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  deplist;
  char *value_local;
  int depender_index_local;
  cmComputeLinkDepends *this_local;
  
  deplist.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)value;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_38);
  __s = deplist.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,(char *)__s,&local_59);
  cmSystemTools::ExpandListArgument
            (&local_58,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_38,false);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator(&local_59);
  std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::vector
            ((vector<cmLinkItem,_std::allocator<cmLinkItem>_> *)local_88);
  __range1._4_4_ = GENERAL_LibraryType;
  bVar1 = false;
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_38);
  d = (string *)
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_38);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)&d), bVar2) {
    var.field_2._8_8_ =
         __gnu_cxx::
         __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::operator*(&__end1);
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            var.field_2._8_8_,"debug");
    if (bVar2) {
      __range1._4_4_ = DEBUG_LibraryType;
      bVar1 = true;
    }
    else {
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              var.field_2._8_8_,"optimized");
      if (bVar2) {
        __range1._4_4_ = OPTIMIZED_LibraryType;
        bVar1 = true;
      }
      else {
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )var.field_2._8_8_,"general");
        if (bVar2) {
          __range1._4_4_ = GENERAL_LibraryType;
          bVar1 = true;
        }
        else {
          uVar4 = std::__cxx11::string::empty();
          if ((uVar4 & 1) == 0) {
            if (!bVar1) {
              std::__cxx11::string::string((string *)&val,(string *)var.field_2._8_8_);
              std::__cxx11::string::operator+=((string *)&val,"_LINK_TYPE");
              __s1 = cmMakefile::GetDefinition(this->Makefile,(string *)&val);
              if (__s1 != (char *)0x0) {
                iVar3 = strcmp(__s1,"debug");
                if (iVar3 == 0) {
                  __range1._4_4_ = DEBUG_LibraryType;
                }
                else {
                  iVar3 = strcmp(__s1,"optimized");
                  if (iVar3 == 0) {
                    __range1._4_4_ = OPTIMIZED_LibraryType;
                  }
                }
              }
              std::__cxx11::string::~string((string *)&val);
            }
            if ((__range1._4_4_ == GENERAL_LibraryType) || (__range1._4_4_ == this->LinkType)) {
              ResolveLinkItem((cmLinkItem *)
                              &item.Backtrace.TopEntry.
                               super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                               ._M_refcount,this,depender_index,(string *)var.field_2._8_8_);
              std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::emplace_back<cmLinkItem>
                        ((vector<cmLinkItem,_std::allocator<cmLinkItem>_> *)local_88,
                         (cmLinkItem *)
                         &item.Backtrace.TopEntry.
                          super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount);
              cmLinkItem::~cmLinkItem
                        ((cmLinkItem *)
                         &item.Backtrace.TopEntry.
                          super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount);
            }
            else if ((this->OldLinkDirMode & 1U) != 0) {
              ResolveLinkItem((cmLinkItem *)local_148,this,depender_index,
                              (string *)var.field_2._8_8_);
              CheckWrongConfigItem(this,(cmLinkItem *)local_148);
              cmLinkItem::~cmLinkItem((cmLinkItem *)local_148);
            }
            __range1._4_4_ = GENERAL_LibraryType;
            bVar1 = false;
          }
        }
      }
    }
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  AddLinkEntries<cmLinkItem>
            (this,depender_index,(vector<cmLinkItem,_std::allocator<cmLinkItem>_> *)local_88);
  std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::~vector
            ((vector<cmLinkItem,_std::allocator<cmLinkItem>_> *)local_88);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_38);
  return;
}

Assistant:

void cmComputeLinkDepends::AddVarLinkEntries(int depender_index,
                                             const char* value)
{
  // This is called to add the dependencies named by
  // <item>_LIB_DEPENDS.  The variable contains a semicolon-separated
  // list.  The list contains link-type;item pairs and just items.
  std::vector<std::string> deplist;
  cmSystemTools::ExpandListArgument(value, deplist);

  // Look for entries meant for this configuration.
  std::vector<cmLinkItem> actual_libs;
  cmTargetLinkLibraryType llt = GENERAL_LibraryType;
  bool haveLLT = false;
  for (std::string const& d : deplist) {
    if (d == "debug") {
      llt = DEBUG_LibraryType;
      haveLLT = true;
    } else if (d == "optimized") {
      llt = OPTIMIZED_LibraryType;
      haveLLT = true;
    } else if (d == "general") {
      llt = GENERAL_LibraryType;
      haveLLT = true;
    } else if (!d.empty()) {
      // If no explicit link type was given prior to this entry then
      // check if the entry has its own link type variable.  This is
      // needed for compatibility with dependency files generated by
      // the export_library_dependencies command from CMake 2.4 and
      // lower.
      if (!haveLLT) {
        std::string var = d;
        var += "_LINK_TYPE";
        if (const char* val = this->Makefile->GetDefinition(var)) {
          if (strcmp(val, "debug") == 0) {
            llt = DEBUG_LibraryType;
          } else if (strcmp(val, "optimized") == 0) {
            llt = OPTIMIZED_LibraryType;
          }
        }
      }

      // If the library is meant for this link type then use it.
      if (llt == GENERAL_LibraryType || llt == this->LinkType) {
        actual_libs.emplace_back(this->ResolveLinkItem(depender_index, d));
      } else if (this->OldLinkDirMode) {
        cmLinkItem item = this->ResolveLinkItem(depender_index, d);
        this->CheckWrongConfigItem(item);
      }

      // Reset the link type until another explicit type is given.
      llt = GENERAL_LibraryType;
      haveLLT = false;
    }
  }

  // Add the entries from this list.
  this->AddLinkEntries(depender_index, actual_libs);
}